

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling.cpp
# Opt level: O1

int __thiscall ncnn::Pooling::forward(Pooling *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  undefined4 uVar3;
  size_t sVar4;
  void *pvVar5;
  size_t sVar6;
  undefined4 uVar7;
  int iVar8;
  float *pfVar9;
  void *pvVar10;
  long lVar11;
  float *pfVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  uint _w;
  int iVar19;
  int iVar20;
  uint uVar21;
  int iVar22;
  ulong uVar23;
  ulong uVar24;
  void *pvVar25;
  float *pfVar26;
  float *pfVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  long lVar32;
  int k;
  int iVar33;
  bool bVar34;
  float fVar35;
  ulong local_118;
  allocator_type local_f1;
  ulong local_f0;
  Mat local_e8;
  void *local_a8;
  ulong local_a0;
  Pooling *local_98;
  float *local_90;
  float *local_88;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  ulong local_70;
  float *local_68;
  void *local_60;
  long local_58;
  long local_50;
  vector<int,_std::allocator<int>_> _space_ofs;
  
  iVar16 = bottom_blob->w;
  iVar18 = bottom_blob->h;
  uVar21 = bottom_blob->c;
  uVar31 = (ulong)uVar21;
  sVar4 = bottom_blob->elemsize;
  if (this->global_pooling != 0) {
    Mat::create(top_blob,uVar21,sVar4,opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    uVar17 = iVar18 * iVar16;
    if (this->pooling_type == 0) {
      if ((int)uVar21 < 1) {
        return 0;
      }
      pvVar10 = bottom_blob->data;
      lVar11 = bottom_blob->cstep * bottom_blob->elemsize;
      pvVar5 = top_blob->data;
      uVar23 = 0;
      pvVar25 = pvVar10;
      do {
        fVar35 = *(float *)((long)pvVar10 + lVar11 * uVar23);
        if (0 < (int)uVar17) {
          uVar24 = 0;
          do {
            fVar1 = *(float *)((long)pvVar25 + uVar24 * 4);
            if (fVar35 <= fVar1) {
              fVar35 = fVar1;
            }
            uVar24 = uVar24 + 1;
          } while (uVar17 != uVar24);
        }
        *(float *)((long)pvVar5 + uVar23 * 4) = fVar35;
        uVar23 = uVar23 + 1;
        pvVar25 = (void *)((long)pvVar25 + lVar11);
      } while (uVar23 != uVar31);
    }
    else {
      if (this->pooling_type != 1) {
        return 0;
      }
      if ((int)uVar21 < 1) {
        return 0;
      }
      pvVar10 = bottom_blob->data;
      sVar4 = bottom_blob->cstep;
      pvVar5 = top_blob->data;
      sVar6 = bottom_blob->elemsize;
      uVar23 = 0;
      do {
        fVar35 = 0.0;
        if (0 < (int)uVar17) {
          uVar24 = 0;
          do {
            fVar35 = fVar35 + *(float *)((long)pvVar10 + uVar24 * 4);
            uVar24 = uVar24 + 1;
          } while (uVar17 != uVar24);
        }
        *(float *)((long)pvVar5 + uVar23 * 4) = fVar35 * (1.0 / (float)(int)uVar17);
        uVar23 = uVar23 + 1;
        pvVar10 = (void *)((long)pvVar10 + sVar4 * sVar6);
      } while (uVar23 != uVar31);
    }
    return 0;
  }
  local_e8.data = bottom_blob->data;
  local_e8.refcount = bottom_blob->refcount;
  local_e8.allocator = bottom_blob->allocator;
  local_e8.dims = bottom_blob->dims;
  if (local_e8.refcount != (int *)0x0) {
    LOCK();
    *local_e8.refcount = *local_e8.refcount + 1;
    UNLOCK();
  }
  uVar3 = bottom_blob->w;
  uVar7 = bottom_blob->h;
  local_e8.c = bottom_blob->c;
  local_e8.cstep = bottom_blob->cstep;
  if (this->pooling_type == 0) {
    fVar35 = -3.4028235e+38;
  }
  else {
    fVar35 = 0.0;
  }
  iVar19 = this->pad_mode;
  local_e8.elemsize = sVar4;
  local_e8.w = uVar3;
  local_e8.h = uVar7;
  if (iVar19 == 2) {
    iVar19 = 0;
    iVar13 = ~((iVar16 + -1) % this->stride_w) + this->kernel_w;
    iVar33 = ~((iVar18 + -1) % this->stride_h) + this->kernel_h;
    if ((iVar13 < 1) && (iVar33 < 1)) {
LAB_00113bbf:
      bVar34 = true;
      iVar16 = local_e8.w;
      iVar18 = local_e8.h;
    }
    else {
      copy_make_border(bottom_blob,&local_e8,iVar33 / 2,iVar33 - iVar33 / 2,iVar13 / 2,
                       iVar13 - iVar13 / 2,0,fVar35,opt->workspace_allocator,opt->num_threads);
      if (local_e8.data == (void *)0x0) {
        bVar34 = false;
      }
      else {
        if ((long)local_e8.c * local_e8.cstep != 0) goto LAB_00113bbf;
        bVar34 = false;
      }
    }
    iVar13 = -100;
    iVar33 = 0;
    if (!bVar34) goto LAB_00114265;
  }
  else {
    if (iVar19 == 1) {
      copy_make_border(bottom_blob,&local_e8,this->pad_top,this->pad_bottom,this->pad_left,
                       this->pad_right,0,fVar35,opt->workspace_allocator,opt->num_threads);
      iVar13 = -100;
      if ((local_e8.data == (void *)0x0) ||
         (iVar16 = local_e8.w, iVar18 = local_e8.h, (long)local_e8.c * local_e8.cstep == 0))
      goto LAB_00114265;
    }
    else if (iVar19 == 0) {
      iVar19 = ((iVar16 + this->pad_left + this->pad_right) - this->kernel_w) % this->stride_w;
      iVar13 = ((iVar18 + this->pad_top + this->pad_bottom) - this->kernel_h) % this->stride_h;
      iVar33 = this->stride_w - iVar19;
      if (iVar19 == 0) {
        iVar33 = 0;
      }
      iVar19 = this->stride_h - iVar13;
      if (iVar13 == 0) {
        iVar19 = 0;
      }
      copy_make_border(bottom_blob,&local_e8,this->pad_top,this->pad_bottom + iVar19,this->pad_left,
                       this->pad_right + iVar33,0,fVar35,opt->workspace_allocator,opt->num_threads);
      bVar34 = (long)local_e8.c * local_e8.cstep != 0;
      if (local_e8.data != (void *)0x0 && bVar34) {
        iVar16 = local_e8.w;
        iVar18 = local_e8.h;
      }
      iVar13 = -100;
      if (local_e8.data == (void *)0x0 || !bVar34) goto LAB_00114265;
      goto LAB_00113c86;
    }
    iVar19 = 0;
    iVar33 = 0;
  }
LAB_00113c86:
  iVar8 = (iVar16 - this->kernel_w) / this->stride_w;
  uVar23 = (long)(iVar18 - this->kernel_h) / (long)this->stride_h;
  local_a0 = uVar23 & 0xffffffff;
  _w = iVar8 + 1;
  uVar17 = (int)uVar23 + 1;
  uVar23 = (ulong)uVar17;
  Mat::create(top_blob,_w,uVar17,uVar21,sVar4,opt->blob_allocator);
  iVar13 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    uVar24 = (long)this->kernel_h * (long)this->kernel_w;
    std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,uVar24,&local_f1);
    if (0 < this->kernel_h) {
      iVar18 = this->kernel_w;
      iVar13 = 0;
      iVar14 = 0;
      iVar20 = 0;
      do {
        if (0 < this->kernel_w) {
          lVar11 = 0;
          do {
            _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start[iVar20 + lVar11] = iVar14 + (int)lVar11;
            lVar11 = lVar11 + 1;
            iVar22 = (int)lVar11;
          } while (iVar22 < this->kernel_w);
          iVar20 = iVar20 + iVar22;
          iVar14 = iVar14 + iVar22;
        }
        iVar14 = iVar14 + (iVar16 - iVar18);
        iVar13 = iVar13 + 1;
      } while (iVar13 < this->kernel_h);
    }
    iVar16 = (int)uVar24;
    if (this->pooling_type == 0) {
      if (0 < (int)uVar21) {
        local_88 = (float *)CONCAT44(local_88._4_4_,local_e8.w);
        local_90 = (float *)(top_blob->cstep * top_blob->elemsize);
        local_a8 = top_blob->data;
        local_f0 = 0;
        do {
          if (-1 < (int)local_a0) {
            pvVar10 = (void *)((long)local_90 * local_f0 + (long)local_a8);
            iVar18 = this->stride_h;
            iVar19 = this->stride_w;
            uVar23 = 0;
            do {
              if (-1 < iVar8) {
                lVar11 = (long)(iVar18 * local_e8.w * (int)uVar23) * 4 +
                         local_e8.cstep * local_e8.elemsize * local_f0;
                uVar29 = 0;
                do {
                  lVar32 = uVar29 * (long)iVar19;
                  fVar35 = *(float *)((long)local_e8.data + lVar32 * 4 + lVar11);
                  if (0 < iVar16) {
                    uVar30 = 0;
                    do {
                      fVar1 = *(float *)((long)local_e8.data +
                                        (long)_space_ofs.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start[uVar30] * 4 +
                                        lVar32 * 4 + lVar11);
                      if (fVar35 <= fVar1) {
                        fVar35 = fVar1;
                      }
                      uVar30 = uVar30 + 1;
                    } while ((uVar24 & 0xffffffff) != uVar30);
                  }
                  *(float *)((long)pvVar10 + uVar29 * 4) = fVar35;
                  uVar29 = uVar29 + 1;
                } while (uVar29 != _w);
              }
              pvVar10 = (void *)((long)pvVar10 + (long)(int)_w * 4);
              uVar23 = uVar23 + 1;
            } while (uVar23 != (int)local_a0 + 1);
          }
          local_f0 = local_f0 + 1;
        } while (local_f0 != uVar31);
      }
    }
    else if ((this->pooling_type == 1) && (0 < (int)uVar21)) {
      local_74 = -iVar19;
      local_58 = local_e8.cstep * local_e8.elemsize;
      local_a8 = (void *)(top_blob->cstep * top_blob->elemsize);
      local_f0 = (ulong)(int)_w;
      local_78 = this->pad_top;
      iVar18 = this->kernel_h;
      iVar13 = this->kernel_w;
      local_7c = this->pad_bottom;
      iVar14 = this->pad_left;
      lVar11 = (long)iVar8;
      iVar20 = this->pad_right;
      local_60 = local_e8.data;
      local_80 = local_e8.w;
      local_68 = (float *)top_blob->data;
      uVar29 = (ulong)_w;
      pfVar26 = local_68 + top_blob->w * (int)local_a0;
      local_50 = lVar11 * 4 + 4;
      local_118 = 0;
      pfVar12 = local_68 + lVar11;
      pfVar9 = local_68;
      pfVar27 = local_68;
      do {
        local_90 = pfVar9;
        local_88 = pfVar12;
        if (-1 < (int)local_a0) {
          pfVar12 = (float *)((long)local_a8 * local_118 + (long)local_68);
          iVar22 = this->stride_h;
          iVar2 = this->stride_w;
          uVar30 = 0;
          do {
            if (-1 < iVar8) {
              uVar28 = 0;
              do {
                if (iVar16 < 1) {
                  fVar35 = 0.0;
                }
                else {
                  fVar35 = 0.0;
                  uVar15 = 0;
                  do {
                    fVar35 = fVar35 + *(float *)((long)local_e8.data +
                                                (long)_space_ofs.
                                                      super__Vector_base<int,_std::allocator<int>_>.
                                                      _M_impl.super__Vector_impl_data._M_start
                                                      [uVar15] * 4 +
                                                uVar28 * (long)iVar2 * 4 +
                                                (long)(iVar22 * local_e8.w * (int)uVar30) * 4 +
                                                local_58 * local_118);
                    uVar15 = uVar15 + 1;
                  } while ((uVar24 & 0xffffffff) != uVar15);
                }
                pfVar12[uVar28] = fVar35 * (1.0 / (float)iVar16);
                uVar28 = uVar28 + 1;
              } while (uVar28 != uVar29);
            }
            pfVar12 = pfVar12 + local_f0;
            uVar30 = uVar30 + 1;
          } while (uVar30 != uVar23);
        }
        if ((local_78 != 0) && (-1 < iVar8)) {
          uVar30 = 0;
          do {
            pfVar27[uVar30] = pfVar27[uVar30] * (float)iVar18 * (1.0 / (float)(iVar18 - local_78));
            uVar30 = uVar30 + 1;
          } while (uVar29 != uVar30);
        }
        if ((local_7c != local_74) && (-1 < iVar8)) {
          uVar30 = 0;
          do {
            pfVar26[uVar30] =
                 pfVar26[uVar30] * (float)iVar18 * (1.0 / (float)(iVar18 - (iVar19 + local_7c)));
            uVar30 = uVar30 + 1;
          } while (uVar29 != uVar30);
        }
        pfVar12 = local_90;
        uVar30 = uVar23;
        if (iVar14 != 0 && -1 < (int)local_a0) {
          do {
            *pfVar12 = *pfVar12 * (float)iVar13 * (1.0 / (float)(iVar13 - iVar14));
            uVar21 = (int)uVar30 - 1;
            pfVar12 = pfVar12 + lVar11 + 1;
            uVar30 = (ulong)uVar21;
          } while (uVar21 != 0);
        }
        pfVar12 = local_88;
        uVar30 = uVar23;
        if (iVar20 != -iVar33 && -1 < (int)local_a0) {
          do {
            *pfVar12 = *pfVar12 * (float)iVar13 * (1.0 / (float)(iVar13 - (iVar20 + iVar33)));
            uVar21 = (int)uVar30 - 1;
            pfVar12 = pfVar12 + lVar11 + 1;
            uVar30 = (ulong)uVar21;
          } while (uVar21 != 0);
        }
        local_118 = local_118 + 1;
        pfVar27 = (float *)((long)pfVar27 + (long)local_a8);
        pfVar26 = (float *)((long)pfVar26 + (long)local_a8);
        pfVar12 = (float *)((long)local_88 + (long)local_a8);
        pfVar9 = (float *)((long)local_90 + (long)local_a8);
      } while (local_118 != uVar31);
    }
    local_98 = this;
    local_70 = uVar31;
    if (_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    iVar13 = 0;
  }
LAB_00114265:
  if (local_e8.refcount != (int *)0x0) {
    LOCK();
    *local_e8.refcount = *local_e8.refcount + -1;
    UNLOCK();
    if (*local_e8.refcount == 0) {
      if (local_e8.allocator == (Allocator *)0x0) {
        if (local_e8.data != (void *)0x0) {
          free(*(void **)((long)local_e8.data + -8));
        }
      }
      else {
        (**(code **)(*(long *)local_e8.allocator + 8))();
      }
    }
  }
  return iVar13;
}

Assistant:

int Pooling::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // max value in NxN window
    // avg value in NxN window

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

//     fprintf(stderr, "Pooling     input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d\n", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);
    if (global_pooling)
    {
        top_blob.create(channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        int size = w * h;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float max = ptr[0];
                for (int i=0; i<size; i++)
                {
                    max = std::max(max, ptr[i]);
                }

                top_blob[q] = max;
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float sum = 0.f;
                for (int i=0; i<size; i++)
                {
                    sum += ptr[i];
                }

                top_blob[q] = sum / size;
            }
        }

        return 0;
    }

    Mat bottom_blob_bordered = bottom_blob;

    float pad_value = 0.f;
    if (pooling_type == PoolMethod_MAX)
    {
        pad_value = -FLT_MAX;
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        pad_value = 0.f;
    }

    int wtailpad = 0;
    int htailpad = 0;

    if (pad_mode == 0) // full padding
    {
        int wtail = (w + pad_left + pad_right - kernel_w) % stride_w;
        int htail = (h + pad_top + pad_bottom - kernel_h) % stride_h;

        if (wtail != 0)
            wtailpad = stride_w - wtail;
        if (htail != 0)
            htailpad = stride_h - htail;

        copy_make_border(bottom_blob, bottom_blob_bordered, pad_top, pad_bottom + htailpad, pad_left, pad_right + wtailpad, BORDER_CONSTANT, pad_value, opt.workspace_allocator, opt.num_threads);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_mode == 1) // valid padding
    {
        copy_make_border(bottom_blob, bottom_blob_bordered, pad_top, pad_bottom, pad_left, pad_right, BORDER_CONSTANT, pad_value, opt.workspace_allocator, opt.num_threads);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_mode == 2) // tensorflow padding=SAME
    {
        int wpad = kernel_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            copy_make_border(bottom_blob, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, pad_value, opt.workspace_allocator, opt.num_threads);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }

    int outw = (w - kernel_w) / stride_w + 1;
    int outh = (h - kernel_h) / stride_h + 1;

    top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w - kernel_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2++;
            }
            p2 += gap;
        }
    }

    if (pooling_type == PoolMethod_MAX)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const Mat m = bottom_blob_bordered.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i*stride_h) + j*stride_w;

                    float max = sptr[0];

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[ space_ofs[k] ];
                        max = std::max(max, val);
                    }

                    outptr[j] = max;
                }

                outptr += outw;
            }
        }
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const Mat m = bottom_blob_bordered.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i*stride_h) + j*stride_w;

                    float sum = 0;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[ space_ofs[k] ];
                        sum += val;
                    }

                    outptr[j] = sum / maxk;
                }

                outptr += outw;
            }

            // fix pad
            if (pad_top != 0)
            {
                const float scale = (float)kernel_h / (kernel_h - pad_top);

                outptr = top_blob.channel(q).row(0);
                for (int i = 0; i < outw; i++)
                {
                    outptr[i] *= scale;
                }
            }
            if (pad_bottom + htailpad != 0)
            {
                const float scale = (float)kernel_h / (kernel_h - pad_bottom - htailpad);

                outptr = top_blob.channel(q).row(outh - 1);
                for (int i = 0; i < outw; i++)
                {
                    outptr[i] *= scale;
                }
            }
            if (pad_left != 0)
            {
                const float scale = (float)kernel_w / (kernel_w - pad_left);

                outptr = top_blob.channel(q);
                for (int i = 0; i < outh; i++)
                {
                    *outptr *= scale;
                    outptr += outw;
                }
            }
            if (pad_right + wtailpad != 0)
            {
                const float scale = (float)kernel_w / (kernel_w - pad_right - wtailpad);

                outptr = top_blob.channel(q);
                outptr += outw - 1;
                for (int i = 0; i < outh; i++)
                {
                    *outptr *= scale;
                    outptr += outw;
                }
            }
        }
    }

    return 0;
}